

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.hpp
# Opt level: O1

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,xoshiro256plus *R)

{
  undefined4 uVar1;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *pbVar2;
  status_type S_new;
  delim_c local_63;
  delim_c local_62;
  delim_c local_61;
  delim_str local_60;
  status_type local_58;
  
  local_58.r[2] = 0;
  local_58.r[3] = 0;
  local_58.r[0] = 0x8000000000000000;
  local_58.r[1] = 0;
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  utility::operator>>(in,(ignore_spaces_cl *)&local_60);
  local_61.c = '[';
  pbVar2 = utility::operator>>(in,&local_61);
  local_60.str = xoshiro256plus::name();
  pbVar2 = utility::operator>>(pbVar2,&local_60);
  local_62.c = ' ';
  pbVar2 = utility::operator>>(pbVar2,&local_62);
  pbVar2 = operator>>(pbVar2,&local_58);
  local_63.c = ']';
  utility::operator>>(pbVar2,&local_63);
  if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
    (R->S).r[2] = local_58.r[2];
    (R->S).r[3] = local_58.r[3];
    (R->S).r[0] = local_58.r[0];
    (R->S).r[1] = local_58.r[1];
  }
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, xoshiro256plus &R) {
      xoshiro256plus::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(xoshiro256plus::name()) >>
          utility::delim(' ') >> S_new >> utility::delim(']');
      if (in) {
        R.S = S_new;
      }
      in.flags(flags);
      return in;
    }